

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d9.cpp
# Opt level: O2

int32 rw::d3d9::getSizeNativeData(void *object,int32 param_2,int32 param_3)

{
  int *piVar1;
  uint32 uVar2;
  int iVar3;
  
  piVar1 = *(int **)((long)object + 0x98);
  iVar3 = 0;
  if ((piVar1 != (int *)0x0) && (iVar3 = 0, *piVar1 == 9)) {
    iVar3 = piVar1[2];
    uVar2 = getDeclaration(*(void **)(piVar1 + 0x16),(VertexElement *)0x0);
    iVar3 = iVar3 * 0x24 + uVar2 * 8 + piVar1[0x18] * 2 +
            (piVar1[0x11] + piVar1[0xb]) * piVar1[0x19] + 0x78;
  }
  return iVar3;
}

Assistant:

int32
getSizeNativeData(void *object, int32, int32)
{
	Geometry *geometry = (Geometry*)object;
	if(geometry->instData == nil ||
	   geometry->instData->platform != PLATFORM_D3D9)
		return 0;
	InstanceDataHeader *header = (InstanceDataHeader*)geometry->instData;
	int32 size = 12 + 4 + 4 + 64 + header->numMeshes*36;
	uint32 numElt = getDeclaration(header->vertexDeclaration, nil);
	size += 4 + numElt*8;
	size += 2*header->totalNumIndex;
	size += 0x10 + header->vertexStream[0].stride*header->totalNumVertex;
	size += 0x10 + header->vertexStream[1].stride*header->totalNumVertex;
	return size;
}